

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestRequiredNoMaskMulti::_InternalSerialize
          (TestRequiredNoMaskMulti *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  anon_union_36_1_493b367e_for_TestRequiredNoMaskMulti_11 aVar2;
  uint8_t *puVar3;
  
  aVar2 = this->field_0;
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x40) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (1,(this->field_0)._impl_.required_enum_1_,puVar3);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x1) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (2,(this->field_0)._impl_.required_enum_2_,puVar3);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x2) != (undefined1  [36])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.a_3_,target);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x4) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (4,(this->field_0)._impl_.required_enum_4_,puVar3);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x8) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x40,(this->field_0)._impl_.required_enum_64_,puVar3);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x10) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray
                       (0x46,(this->field_0)._impl_.required_fixed32_70_,puVar3);
  }
  if (((undefined1  [36])aVar2 & (undefined1  [36])0x20) != (undefined1  [36])0x0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray
                       (0x50,(this->field_0)._impl_.required_fixed32_80_,puVar3);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredNoMaskMulti::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredNoMaskMulti& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestRequiredNoMaskMulti)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.ForeignEnum required_enum_1 = 1 [features = {
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_required_enum_1(), target);
  }

  // .edition_unittest.TestRequiredNoMaskMulti.NestedEnum required_enum_2 = 2 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_required_enum_2(), target);
  }

  // int32 a_3 = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_a_3(), target);
  }

  // .edition_unittest.TestRequiredNoMaskMulti.NestedEnum required_enum_4 = 4 [features = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_required_enum_4(), target);
  }

  // .edition_unittest.TestRequiredNoMaskMulti.NestedEnum required_enum_64 = 64 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        64, this_._internal_required_enum_64(), target);
  }

  // fixed32 required_fixed32_70 = 70 [features = {
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        70, this_._internal_required_fixed32_70(), target);
  }

  // fixed32 required_fixed32_80 = 80 [features = {
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        80, this_._internal_required_fixed32_80(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestRequiredNoMaskMulti)
  return target;
}